

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O1

void __thiscall
chrono::ChArchiveExplorer::out_array_pre(ChArchiveExplorer *this,ChValue *bVal,size_t msize)

{
  pointer *pppCVar1;
  pointer pbVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  ChValue *in_RAX;
  undefined4 extraout_var;
  ChValue *local_18;
  
  if ((this->found != true) || (this->find_all == true)) {
    pbVar2 = (this->search_tokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)this->tablevel <
        (ulong)((long)(this->search_tokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
      local_18 = in_RAX;
      bVar3 = MatchName(this,pbVar2 + this->tablevel,(bVal->_name)._M_dataplus._M_p);
      if (this->tablevel == 0 || bVar3) {
        this->found_obj = true;
        if ((long)(this->search_tokens).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->search_tokens).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5 == (long)this->tablevel + 1) {
          iVar4 = (*bVal->_vptr_ChValue[2])(bVal);
          local_18 = (ChValue *)CONCAT44(extraout_var,iVar4);
          __position._M_current =
               (this->results).
               super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->results).
              super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<chrono::ChValue*,std::allocator<chrono::ChValue*>>::
            _M_realloc_insert<chrono::ChValue*>
                      ((vector<chrono::ChValue*,std::allocator<chrono::ChValue*>> *)&this->results,
                       __position,&local_18);
          }
          else {
            *__position._M_current = local_18;
            pppCVar1 = &(this->results).
                        super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
          this->found = true;
        }
        this->tablevel = this->tablevel + 1;
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,true);
      }
    }
  }
  return;
}

Assistant:

virtual void out_array_pre (ChValue& bVal, size_t msize) {
            if (this->found && !this->find_all) return;
            if (this->tablevel >= this->search_tokens.size()) return;

            if (this->MatchName(search_tokens[this->tablevel], bVal.name()) || tablevel==0) {
                this->found_obj = true;
                
                if (this->tablevel +1 == this->search_tokens.size()) {
                    this->results.push_back(bVal.new_clone());
                    this->found = true;
                } 
                ++tablevel;
                in_array.push_back(true);
            }  
      }